

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbbackingstore.cpp
# Opt level: O0

void __thiscall QFbBackingStore::resize(QFbBackingStore *this,QSize *size,QRegion *staticContents)

{
  bool bVar1;
  Format FVar2;
  long *plVar3;
  QSize *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QSize *in_stack_ffffffffffffffa8;
  QSize *in_stack_ffffffffffffffb0;
  QImage local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QImage::size();
  bVar1 = operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    QPlatformBackingStore::window();
    QWindow::screen();
    plVar3 = (long *)QScreen::handle();
    FVar2 = (**(code **)(*plVar3 + 0x38))();
    QImage::QImage(local_28,in_RSI,FVar2);
    QImage::operator=(in_RDI,(QImage *)in_RSI);
    QImage::~QImage(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    if (mImage.size() != size)
        mImage = QImage(size, window()->screen()->handle()->format());
}